

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_semantic_analysis.cpp
# Opt level: O0

compile_errcode __thiscall
ArgumentList::Action
          (ArgumentList *this,vector<_SymbolType,_std::allocator<_SymbolType>_> *argument_type)

{
  LogTools *this_00;
  bool bVar1;
  value_type local_dc [2];
  SymbolKind local_d4;
  undefined1 local_d0 [8];
  SymbolTableTerm term;
  allocator local_81;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  value_type local_3c [3];
  int local_30;
  int character_number;
  int line_number;
  SymbolName name;
  int state;
  int ret;
  vector<_SymbolType,_std::allocator<_SymbolType>_> *argument_type_local;
  ArgumentList *this_local;
  
  name = WHILE_SYM;
  line_number = 0;
  _state = argument_type;
  argument_type_local = (vector<_SymbolType,_std::allocator<_SymbolType>_> *)this;
  do {
    character_number = SymbolQueue::GetCurrentName(handle_correct_queue);
    local_30 = SymbolQueue::GetCurrentLine(handle_correct_queue);
    local_3c[2] = SymbolQueue::GetCurrentCharacter(handle_correct_queue);
    switch(line_number) {
    case 0:
      if (character_number == 0x1d) {
        return 0;
      }
      bVar1 = IsValidVariableType(character_number);
      if (!bVar1) {
        return -1;
      }
      if (character_number == 8) {
        local_3c[1] = 0;
        std::vector<_SymbolType,_std::allocator<_SymbolType>_>::push_back(_state,local_3c + 1);
      }
      else if (character_number == 9) {
        local_3c[0] = CHAR;
        std::vector<_SymbolType,_std::allocator<_SymbolType>_>::push_back(_state,local_3c);
      }
      else {
        fprintf(_stderr,"invalid function argument type\n");
      }
      line_number = 1;
      this->m_type = character_number;
      break;
    case 1:
      if (character_number != 0x22) {
        return -1;
      }
      SymbolQueue::GetCurrentValue<std::__cxx11::string>(&local_60,handle_correct_queue);
      std::__cxx11::string::operator=((string *)&this->m_identifier_name,(string *)&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      bVar1 = SymbolTableTree::FindTerm(symbol_table_tree,&this->m_identifier_name,true);
      this_00 = g_log_tools;
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_80,"repeat definition identifier(para)",&local_81);
        LogTools::SemanticErrorLogs(this_00,&local_80,&this->m_identifier_name,local_30,local_3c[2])
        ;
        std::__cxx11::string::~string((string *)&local_80);
        std::allocator<char>::~allocator((allocator<char> *)&local_81);
      }
      local_d4 = PARAMETER;
      SymbolTableTerm::SymbolTableTerm
                ((SymbolTableTerm *)local_d0,&this->m_identifier_name,&local_d4,&this->m_type);
      SymbolTableTree::Insert(symbol_table_tree,(SymbolTableTerm *)local_d0);
      line_number = 2;
      SymbolTableTerm::~SymbolTableTerm((SymbolTableTerm *)local_d0);
      break;
    case 2:
      if (character_number != 0x17) {
        return 0;
      }
      line_number = 3;
      break;
    case 3:
      bVar1 = IsValidVariableType(character_number);
      if (!bVar1) {
        return -1;
      }
      if (character_number == 8) {
        local_dc[1] = 0;
        std::vector<_SymbolType,_std::allocator<_SymbolType>_>::push_back(_state,local_dc + 1);
      }
      else if (character_number == 9) {
        local_dc[0] = CHAR;
        std::vector<_SymbolType,_std::allocator<_SymbolType>_>::push_back(_state,local_dc);
      }
      else {
        fprintf(_stderr,"invalid function argument type\n");
      }
      line_number = 1;
      this->m_type = character_number;
    }
    SymbolQueue::NextSymbol(handle_correct_queue);
  } while( true );
}

Assistant:

compile_errcode ArgumentList::Action(vector<SymbolType>& argument_type) {
    int ret = COMPILE_OK;
    int state = 0;
    while (true) {
        SymbolName name = handle_correct_queue->GetCurrentName();
        int line_number = handle_correct_queue->GetCurrentLine();
        int character_number = handle_correct_queue->GetCurrentCharacter();
        switch (state) {
            case 0: {
                if (name == R_CIRCLE_BRACKET_SYM) {
                    return COMPILE_OK;
                } else if (IsValidVariableType(name)) {
                    if (name == INT_SYM) {
                        argument_type.push_back(INT);
                    } else if (name == CHAR_SYM) {
                        argument_type.push_back(CHAR);
                    } else {
                        fprintf(stderr, "invalid function argument type\n");
                    }
                    state = 1;
                    m_type = name;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 1: {
                if (name == IDENTIFIER_SYM) {
                    m_identifier_name = handle_correct_queue->GetCurrentValue<string>();
                    if (symbol_table_tree->FindTerm(m_identifier_name, true)) {
                        g_log_tools->SemanticErrorLogs(string("repeat definition identifier(para)"), m_identifier_name, line_number, character_number);
                    }
                    SymbolTableTerm term(m_identifier_name, PARAMETER, m_type);
                    symbol_table_tree->Insert(term);
                    state = 2;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 2: {
                if (name == COMMA_SYM) {
                    state = 3;
                    break;
                } else {
                    return COMPILE_OK;
                }
            }
            case 3: {
                if (IsValidVariableType(name)) {
                    if (name == INT_SYM) {
                        argument_type.push_back(INT);
                    } else if (name == CHAR_SYM) {
                        argument_type.push_back(CHAR);
                    } else {
                        fprintf(stderr, "invalid function argument type\n");
                    }
                    state = 1;
                    m_type = name;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
        }
        handle_correct_queue->NextSymbol();
    }
}